

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

DynamicObject * Js::DynamicObject::BoxStackInstance(DynamicObject *instance,bool deepCopy)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_8_2_815e7e51_for_DynamicObject_2 aVar4;
  undefined4 extraout_var;
  
  bVar2 = ThreadContext::IsOnStack(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                ,0x418,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  aVar4 = instance[-1].field_1;
  if (aVar4 == (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) {
    aVar4._0_4_ = (*(instance->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x69])
                            (instance,(ulong)deepCopy);
    aVar4._4_4_ = extraout_var;
    instance[-1].field_1 = aVar4;
  }
  return (DynamicObject *)aVar4;
}

Assistant:

DynamicObject *
    DynamicObject::BoxStackInstance(DynamicObject * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        // On the stack, the we reserved a pointer before the object as to store the boxed value
        DynamicObject ** boxedInstanceRef = ((DynamicObject **)instance) - 1;
        DynamicObject * boxedInstance = *boxedInstanceRef;
        if (boxedInstance)
        {
            return boxedInstance;
        }

        boxedInstance = instance->Copy(deepCopy);

        *boxedInstanceRef = boxedInstance;
        return boxedInstance;
    }